

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_x_vmt84.c
# Opt level: O2

void gga_x_vmt84_init(xc_func_type *p)

{
  int iVar1;
  undefined4 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  
  puVar2 = (undefined4 *)malloc(0x10);
  p->params = puVar2;
  iVar1 = p->info->number;
  if (iVar1 == 0x45) {
    uVar3 = 0xe80c25e;
    uVar4 = 0x3fcc1911;
    uVar5 = 0x51d25aab;
    uVar6 = 0x3f13660e;
  }
  else {
    if (iVar1 != 0x44) {
      fwrite("Internal error in gga_x_vmt84\n",0x1e,1,_stderr);
      exit(1);
    }
    uVar3 = 0x3c0ca458;
    uVar4 = 0x3fbf9add;
    uVar5 = 0xf705857b;
    uVar6 = 0x3ef81e03;
  }
  *puVar2 = uVar3;
  puVar2[1] = uVar4;
  puVar2[2] = uVar5;
  puVar2[3] = uVar6;
  return;
}

Assistant:

static void
gga_x_vmt84_init(xc_func_type *p)
{
  gga_x_vmt84_params *params;

  assert(p != NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_x_vmt84_params));
  params = (gga_x_vmt84_params *) (p->params);

  switch(p->info->number){
  case XC_GGA_X_VMT84_PBE:
    params->mu    = 0.2195149727645171;
    params->alpha = 0.000074;
    break;
  case XC_GGA_X_VMT84_GE:
    params->mu = 10.0/81.0;
    params->alpha = 0.000023;
    break;
  default:
    fprintf(stderr, "Internal error in gga_x_vmt84\n");
    exit(1);
  }
}